

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void openStatTable(Parse *pParse,int iDb,int iStatCur,char *zWhere,char *zWhereType)

{
  sqlite3 *psVar1;
  sqlite3 *db_00;
  Db *pDVar2;
  long in_RCX;
  int in_ESI;
  Parse *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  Table *pStat;
  char *zTab;
  int nToOpen;
  Vdbe *v;
  Db *pDb;
  sqlite3 *db;
  int i;
  u8 aCreateTbl [3];
  u32 aRoot [3];
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Vdbe *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int op;
  int local_3c;
  byte local_17 [3];
  undefined1 *local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = in_RDI->db;
  db_00 = (sqlite3 *)
          sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_14 = &DAT_aaaaaaaaaaaaaaaa;
  local_c = 0xaaaaaaaa;
  local_17[0] = 0xaa;
  local_17[1] = 0xaa;
  local_17[2] = 0xaa;
  op = 1;
  if (db_00 != (sqlite3 *)0x0) {
    pDVar2 = psVar1->aDb + in_ESI;
    for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
      in_stack_ffffffffffffff98 = openStatTable::aTable[local_3c].zName;
      local_17[local_3c] = 0;
      in_stack_ffffffffffffff90 =
           (Vdbe *)sqlite3FindTable(db_00,(char *)CONCAT44(op,in_stack_ffffffffffffffa0),
                                    in_stack_ffffffffffffff98);
      if (in_stack_ffffffffffffff90 == (Vdbe *)0x0) {
        if (local_3c < 1) {
          sqlite3NestedParse(in_RDI,"CREATE TABLE %Q.%s(%s)",pDVar2->zDbSName,
                             in_stack_ffffffffffffff98,openStatTable::aTable[local_3c].zCols);
          *(int *)((long)&local_14 + (long)local_3c * 4) = in_RDI->regRoot;
          local_17[local_3c] = 0x10;
        }
      }
      else {
        *(int *)((long)&local_14 + (long)local_3c * 4) = in_stack_ffffffffffffff90->nCursor;
        sqlite3TableLock((Parse *)CONCAT44(op,in_stack_ffffffffffffffa0),
                         (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (Pgno)in_stack_ffffffffffffff98,
                         (u8)((ulong)in_stack_ffffffffffffff90 >> 0x38),
                         (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (in_RCX == 0) {
          sqlite3VdbeAddOp2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                            in_stack_ffffffffffffff88,0);
        }
        else {
          sqlite3NestedParse(in_RDI,"DELETE FROM %Q.%s WHERE %s=%Q",pDVar2->zDbSName,
                             in_stack_ffffffffffffff98,in_R8,in_RCX);
        }
      }
    }
    for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
      sqlite3VdbeAddOp4Int
                ((Vdbe *)db_00,op,in_stack_ffffffffffffffa0,
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      sqlite3VdbeChangeP5((Vdbe *)db_00,(ushort)local_17[local_3c]);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void openStatTable(
  Parse *pParse,          /* Parsing context */
  int iDb,                /* The database we are looking in */
  int iStatCur,           /* Open the sqlite_stat1 table on this cursor */
  const char *zWhere,     /* Delete entries for this table or index */
  const char *zWhereType  /* Either "tbl" or "idx" */
){
  static const struct {
    const char *zName;
    const char *zCols;
  } aTable[] = {
    { "sqlite_stat1", "tbl,idx,stat" },
#if defined(SQLITE_ENABLE_STAT4)
    { "sqlite_stat4", "tbl,idx,neq,nlt,ndlt,sample" },
#else
    { "sqlite_stat4", 0 },
#endif
    { "sqlite_stat3", 0 },
  };
  int i;
  sqlite3 *db = pParse->db;
  Db *pDb;
  Vdbe *v = sqlite3GetVdbe(pParse);
  u32 aRoot[ArraySize(aTable)];
  u8 aCreateTbl[ArraySize(aTable)];
#ifdef SQLITE_ENABLE_STAT4
  const int nToOpen = OptimizationEnabled(db,SQLITE_Stat4) ? 2 : 1;
#else
  const int nToOpen = 1;
#endif

  if( v==0 ) return;
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3VdbeDb(v)==db );
  pDb = &db->aDb[iDb];

  /* Create new statistic tables if they do not exist, or clear them
  ** if they do already exist.
  */
  for(i=0; i<ArraySize(aTable); i++){
    const char *zTab = aTable[i].zName;
    Table *pStat;
    aCreateTbl[i] = 0;
    if( (pStat = sqlite3FindTable(db, zTab, pDb->zDbSName))==0 ){
      if( i<nToOpen ){
        /* The sqlite_statN table does not exist. Create it. Note that a
        ** side-effect of the CREATE TABLE statement is to leave the rootpage
        ** of the new table in register pParse->regRoot. This is important
        ** because the OpenWrite opcode below will be needing it. */
        sqlite3NestedParse(pParse,
            "CREATE TABLE %Q.%s(%s)", pDb->zDbSName, zTab, aTable[i].zCols
        );
        aRoot[i] = (u32)pParse->regRoot;
        aCreateTbl[i] = OPFLAG_P2ISREG;
      }
    }else{
      /* The table already exists. If zWhere is not NULL, delete all entries
      ** associated with the table zWhere. If zWhere is NULL, delete the
      ** entire contents of the table. */
      aRoot[i] = pStat->tnum;
      sqlite3TableLock(pParse, iDb, aRoot[i], 1, zTab);
      if( zWhere ){
        sqlite3NestedParse(pParse,
           "DELETE FROM %Q.%s WHERE %s=%Q",
           pDb->zDbSName, zTab, zWhereType, zWhere
        );
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
      }else if( db->xPreUpdateCallback ){
        sqlite3NestedParse(pParse, "DELETE FROM %Q.%s", pDb->zDbSName, zTab);
#endif
      }else{
        /* The sqlite_stat[134] table already exists.  Delete all rows. */
        sqlite3VdbeAddOp2(v, OP_Clear, (int)aRoot[i], iDb);
      }
    }
  }

  /* Open the sqlite_stat[134] tables for writing. */
  for(i=0; i<nToOpen; i++){
    assert( i<ArraySize(aTable) );
    sqlite3VdbeAddOp4Int(v, OP_OpenWrite, iStatCur+i, (int)aRoot[i], iDb, 3);
    sqlite3VdbeChangeP5(v, aCreateTbl[i]);
    VdbeComment((v, aTable[i].zName));
  }
}